

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_suba_16_pcix(void)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = m68ki_cpu.ir >> 7;
  uVar2 = OPER_PCIX_16();
  piVar1 = (int *)((long)m68ki_cpu.dar + (ulong)(uVar3 & 0x1c) + 0x20);
  *piVar1 = *piVar1 - (int)(short)uVar2;
  return;
}

Assistant:

static void m68k_op_suba_16_pcix(void)
{
	uint* r_dst = &AX;
	uint src = MAKE_INT_16(OPER_PCIX_16());

	*r_dst = MASK_OUT_ABOVE_32(*r_dst - src);
}